

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSimpleRecurrentLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  uint uVar8;
  LayerUnion LVar9;
  bool bVar10;
  char cVar11;
  bool bVar12;
  long *plVar13;
  char cVar14;
  size_type *psVar15;
  undefined1 *puVar16;
  Result *_result;
  char cVar17;
  uint uVar18;
  uint64_t uVar19;
  undefined1 *puVar20;
  string err;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  LayerUnion local_60;
  uint64_t local_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,2,2);
  bVar10 = Result::good(__return_storage_ptr__);
  if (bVar10) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    if (bVar10) {
      validateOutputCount(__return_storage_ptr__,layer,2,2);
      bVar10 = Result::good(__return_storage_ptr__);
      if (bVar10) {
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        if (bVar10) {
          if (this->ndArrayInterpretation == true) {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"SimpleRecurrent","");
            validateInputOutputRankEquality
                      (__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            bVar10 = Result::good(__return_storage_ptr__);
            if (!bVar10) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar10) {
              return __return_storage_ptr__;
            }
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"SimpleRecurrent","");
            validateRankCount(__return_storage_ptr__,layer,&local_a0,5,5,&this->blobNameToRank);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            bVar10 = Result::good(__return_storage_ptr__);
            if (!bVar10) {
              return __return_storage_ptr__;
            }
            pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != paVar1) {
              operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
            }
            if (!bVar10) {
              return __return_storage_ptr__;
            }
          }
          if (layer->_oneof_case_[0] == 400) {
            local_60 = layer->layer_;
          }
          else {
            local_60.convolution_ =
                 (ConvolutionLayerParams *)
                 Specification::_SimpleRecurrentLayerParams_default_instance_;
          }
          puVar20 = (undefined1 *)(local_60.innerproduct_)->bias_;
          if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
            puVar20 = Specification::_WeightParams_default_instance_;
          }
          iVar2 = (((WeightParams *)puVar20)->floatvalue_).current_size_;
          lVar4 = *(long *)(((ulong)(((WeightParams *)puVar20)->float16value_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          uVar18 = (0 < iVar2) + 1;
          if (lVar4 == 0) {
            uVar18 = (uint)(0 < iVar2);
          }
          lVar5 = *(long *)(((ulong)(((WeightParams *)puVar20)->rawvalue_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          lVar6 = *(long *)(((ulong)(((WeightParams *)puVar20)->int8rawvalue_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          uVar8 = (uint)(lVar6 == 0);
          uVar18 = (uVar18 - (lVar5 == 0)) + 2;
          cVar11 = '\x04';
          if (uVar18 - uVar8 < 2) {
            cVar11 = '\x05';
            if (uVar18 != uVar8) {
              cVar11 = iVar2 < 1;
            }
            if ((((lVar4 == 0) && (uVar18 != uVar8)) && (iVar2 < 1)) &&
               ((((lVar5 == 0 || (puVar20 == Specification::_WeightParams_default_instance_)) ||
                 (cVar11 = '\x02',
                 ((WeightParams *)puVar20)->quantization_ == (QuantizationParams *)0x0)) &&
                (((lVar6 == 0 || (puVar20 == Specification::_WeightParams_default_instance_)) ||
                 (cVar11 = '\x03',
                 ((WeightParams *)puVar20)->quantization_ == (QuantizationParams *)0x0)))))) {
              cVar11 = '\x05';
            }
          }
          puVar16 = (undefined1 *)(local_60.batchnorm_)->mean_;
          if ((WeightParams *)puVar16 == (WeightParams *)0x0) {
            puVar16 = Specification::_WeightParams_default_instance_;
          }
          iVar2 = (((WeightParams *)puVar16)->floatvalue_).current_size_;
          lVar4 = *(long *)(((ulong)(((WeightParams *)puVar16)->float16value_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          uVar18 = (0 < iVar2) + 1;
          if (lVar4 == 0) {
            uVar18 = (uint)(0 < iVar2);
          }
          lVar5 = *(long *)(((ulong)(((WeightParams *)puVar16)->rawvalue_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          lVar6 = *(long *)(((ulong)(((WeightParams *)puVar16)->int8rawvalue_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          uVar8 = (uint)(lVar6 == 0);
          uVar18 = (uVar18 - (lVar5 == 0)) + 2;
          cVar14 = '\x04';
          if (uVar18 - uVar8 < 2) {
            cVar14 = '\x05';
            if (uVar18 != uVar8) {
              cVar14 = iVar2 < 1;
            }
            if ((((lVar4 == 0) && (uVar18 != uVar8)) && (iVar2 < 1)) &&
               ((((lVar5 == 0 || (puVar16 == Specification::_WeightParams_default_instance_)) ||
                 (cVar14 = '\x02',
                 ((WeightParams *)puVar16)->quantization_ == (QuantizationParams *)0x0)) &&
                (((lVar6 == 0 || (puVar16 == Specification::_WeightParams_default_instance_)) ||
                 (cVar14 = '\x03',
                 ((WeightParams *)puVar16)->quantization_ == (QuantizationParams *)0x0)))))) {
              cVar14 = '\x05';
            }
          }
          puVar16 = (undefined1 *)(local_60.batchnorm_)->variance_;
          if ((WeightParams *)puVar16 == (WeightParams *)0x0) {
            puVar16 = Specification::_WeightParams_default_instance_;
          }
          iVar2 = (((WeightParams *)puVar16)->floatvalue_).current_size_;
          lVar4 = *(long *)(((ulong)(((WeightParams *)puVar16)->float16value_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          uVar18 = (0 < iVar2) + 1;
          if (lVar4 == 0) {
            uVar18 = (uint)(0 < iVar2);
          }
          lVar5 = *(long *)(((ulong)(((WeightParams *)puVar16)->rawvalue_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          lVar6 = *(long *)(((ulong)(((WeightParams *)puVar16)->int8rawvalue_).tagged_ptr_.ptr_ &
                            0xfffffffffffffffe) + 8);
          uVar8 = (uint)(lVar6 == 0);
          uVar18 = (uVar18 - (lVar5 == 0)) + 2;
          cVar17 = '\x04';
          if (uVar18 - uVar8 < 2) {
            cVar17 = '\x05';
            if (uVar18 != uVar8) {
              cVar17 = iVar2 < 1;
            }
            if (((((lVar4 == 0) && (uVar18 != uVar8)) && (iVar2 < 1)) &&
                (((lVar5 == 0 || (puVar16 == Specification::_WeightParams_default_instance_)) ||
                 (cVar17 = '\x02',
                 ((WeightParams *)puVar16)->quantization_ == (QuantizationParams *)0x0)))) &&
               (((lVar6 == 0 || (puVar16 == Specification::_WeightParams_default_instance_)) ||
                (cVar17 = '\x03',
                ((WeightParams *)puVar16)->quantization_ == (QuantizationParams *)0x0)))) {
              cVar17 = '\x05';
            }
          }
          if (((cVar11 == '\x04') || (cVar14 == '\x04')) ||
             (bVar10 = (local_60.pooling_)->globalpooling_, (cVar17 == '\x04' & bVar10) != 0)) {
            std::operator+(&local_80,"Simple recurrent layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_80);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar15 = (size_type *)(plVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_a0.field_2._M_allocated_capacity = *psVar15;
              local_a0.field_2._8_8_ = plVar13[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar15;
              local_a0._M_dataplus._M_p = (pointer)*plVar13;
            }
            local_a0._M_string_length = plVar13[1];
            *plVar13 = (long)psVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          }
          else {
            if (((cVar11 == '\x02') || (cVar14 == '\x02')) ||
               ((cVar11 == cVar14 &&
                (((cVar17 == '\x02' || (cVar11 == cVar17)) || (bVar10 == false)))))) {
              local_58 = (local_60.simplerecurrent_)->outputvectorsize_;
              uVar19 = (local_60.batchnorm_)->channels_ * local_58;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SimpleRNN","");
              pvVar7 = (layer->name_).tagged_ptr_.ptr_;
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"WeightMatrix","")
              ;
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar20,uVar19,local_58,&local_a0,
                         (string *)((ulong)pvVar7 & 0xfffffffffffffffe),&local_80);
              LVar9 = local_60;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar12 = Result::good(__return_storage_ptr__);
              if (!bVar12) {
                return __return_storage_ptr__;
              }
              pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != paVar1) {
                operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
              }
              puVar20 = (undefined1 *)(LVar9.batchnorm_)->mean_;
              if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
                puVar20 = Specification::_WeightParams_default_instance_;
              }
              uVar19 = (LVar9.simplerecurrent_)->outputvectorsize_;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SimpleRNN","");
              pvVar7 = (layer->name_).tagged_ptr_.ptr_;
              local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_80,"RecursionMatrix","");
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar20,uVar19 * uVar19,uVar19,
                         &local_a0,(string *)((ulong)pvVar7 & 0xfffffffffffffffe),&local_80);
              LVar9 = local_60;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              bVar12 = Result::good(__return_storage_ptr__);
              if (!bVar12) {
                return __return_storage_ptr__;
              }
              pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != paVar1) {
                operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
              }
              if (bVar10 != false) {
                puVar20 = (undefined1 *)(LVar9.batchnorm_)->variance_;
                if ((WeightParams *)puVar20 == (WeightParams *)0x0) {
                  puVar20 = Specification::_WeightParams_default_instance_;
                }
                local_60 = (LayerUnion)(LVar9.simplerecurrent_)->outputvectorsize_;
                local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"SimpleRNN","");
                pvVar7 = (layer->name_).tagged_ptr_.ptr_;
                local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BiasVector","")
                ;
                validateGeneralWeightParams
                          (__return_storage_ptr__,(WeightParams *)puVar20,(uint64_t)local_60,1,
                           &local_a0,(string *)((ulong)pvVar7 & 0xfffffffffffffffe),&local_80);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80._M_dataplus._M_p != &local_80.field_2) {
                  operator_delete(local_80._M_dataplus._M_p,
                                  local_80.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
                bVar10 = Result::good(__return_storage_ptr__);
                if (!bVar10) {
                  return __return_storage_ptr__;
                }
                pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar3 != paVar1) {
                  operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
                }
              }
              if (layer->_oneof_case_[0] == 400) {
                puVar20 = *(undefined1 **)&layer->layer_;
              }
              else {
                puVar20 = Specification::_SimpleRecurrentLayerParams_default_instance_;
              }
              puVar20 = (undefined1 *)(((ActivationParams *)puVar20)->NonlinearityType_).linear_;
              if ((ActivationParams *)puVar20 == (ActivationParams *)0x0) {
                puVar20 = Specification::_ActivationParams_default_instance_;
              }
              validateRecurrentActivationParams(__return_storage_ptr__,(ActivationParams *)puVar20);
              return __return_storage_ptr__;
            }
            std::operator+(&local_80,"Simple recurrent layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_80);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            psVar15 = (size_type *)(plVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_a0.field_2._M_allocated_capacity = *psVar15;
              local_a0.field_2._8_8_ = plVar13[3];
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar15;
              local_a0._M_dataplus._M_p = (pointer)*plVar13;
            }
            local_a0._M_string_length = plVar13[1];
            *plVar13 = (long)psVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSimpleRecurrentLayer(const Specification::NeuralNetworkLayer& layer) {
    // Must specify hidden state
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 2, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, 2));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "SimpleRecurrent", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "SimpleRecurrent", 5, 5, blobNameToRank));
    }

    const auto& params = layer.simplerecurrent();
    bool hasBiasVector = params.hasbiasvector();
    WeightParamType weightMatrixValueType, recursionMatrixValueType, biasVectorValueType;
    weightMatrixValueType = valueType(params.weightmatrix());
    recursionMatrixValueType = valueType(params.recursionmatrix());
    biasVectorValueType = valueType(params.biasvector());

    // Verify all weights are of valid type
    if((weightMatrixValueType == UNSPECIFIED) || recursionMatrixValueType == UNSPECIFIED || (hasBiasVector && biasVectorValueType == UNSPECIFIED)){
        std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // Verify either weightMatrix, recursionMatrix, and biasVector are all FP32 or FP16, or one of them is quantized
    if (weightMatrixValueType != QUINT && recursionMatrixValueType != QUINT){
        if (weightMatrixValueType != recursionMatrixValueType ||
            (hasBiasVector && biasVectorValueType != QUINT && weightMatrixValueType != biasVectorValueType) ){
            std::string err = "Simple recurrent layer '" + layer.name() + "' has invalid weightMatrix/recusionMatrix/Bias fields. "
            "Field value types should match and should either be half or full precision.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // Check weight matrix size
    // input matrix
    uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.weightmatrix(), input_matrix_size,
                                                                  params.outputvectorsize(),
                                                                  "SimpleRNN", layer.name(), "WeightMatrix"));

    // recurrent matrix
    uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.recursionmatrix(), recurrent_matrix_size,
                                                                  params.outputvectorsize(), "SimpleRNN",
                                                                  layer.name(), "RecursionMatrix"));

    // bias
    if (hasBiasVector){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.biasvector(), params.outputvectorsize(), 1,
                                                                      "SimpleRNN", layer.name(), "BiasVector"));
    }
    // Validate the activations as well
    return validateRecurrentActivationParams(layer.simplerecurrent().activation());

}